

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_int,unsigned_char>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  byte bVar2;
  pointer puVar3;
  pointer puVar4;
  Store *this_00;
  Memory *pMVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  RunResult RVar9;
  Value VVar10;
  Value VVar11;
  Value VVar12;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar10 = Pop(this);
  VVar11 = Pop(this);
  pMVar5 = local_80.obj_;
  bVar1 = ((local_80.obj_)->type_).limits.is_64;
  VVar12 = Pop(this);
  uVar7 = (ulong)VVar12.field_0.i32_;
  if (bVar1 != false) {
    uVar7 = VVar12.field_0.i64_;
  }
  uVar6 = (ulong)instr.field_2.imm_u32x2.snd;
  puVar3 = (pMVar5->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (pMVar5->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar8 = (long)puVar4 - (long)puVar3;
  if ((((uVar8 < uVar7 + uVar6 + 1) || (puVar4 == puVar3)) || (uVar8 < uVar7)) || (uVar8 < uVar6)) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_(&local_68,"invalid atomic access at %lu+%u");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar9 = Trap;
  }
  else {
    bVar2 = puVar3[uVar7 + uVar6];
    if (bVar2 == VVar11.field_0._0_1_) {
      puVar3[uVar7 + uVar6] = VVar10.field_0._0_1_;
    }
    RVar9 = Ok;
    Push(this,(Value)ZEXT116(bVar2));
  }
  if (local_80.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_80.store_,local_80.root_index_);
  }
  return RVar9;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}